

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory_semantics.cpp
# Opt level: O0

spv_result_t
spvtools::val::ValidateMemorySemantics
          (ValidationState_t *_,Instruction *inst,uint32_t operand_index,uint32_t memory_scope)

{
  bool bVar1;
  Op OVar2;
  int32_t iVar3;
  MemorySemanticsMask MVar4;
  MemoryModel MVar5;
  MemorySemanticsMask MVar6;
  MemorySemanticsMask MVar7;
  DiagnosticStream *pDVar8;
  spv_const_context psVar9;
  string local_2a68;
  DiagnosticStream local_2a48;
  string local_2870;
  DiagnosticStream local_2850;
  char *local_2678;
  DiagnosticStream local_2670;
  char *local_2498;
  DiagnosticStream local_2490;
  char *local_22b8;
  string local_22b0;
  DiagnosticStream local_2290;
  char *local_20b8;
  string local_20b0;
  DiagnosticStream local_2090;
  char *local_1eb8;
  string local_1eb0;
  DiagnosticStream local_1e90;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_1cb8;
  tuple<bool,_bool,_unsigned_int> local_1ca0;
  uint local_1c98;
  bool local_1c92;
  bool local_1c91;
  uint32_t memory_value;
  bool memory_is_const_int32;
  bool memory_is_int32;
  string local_1c88;
  DiagnosticStream local_1c68;
  byte local_1a89;
  char *pcStack_1a88;
  bool includes_storage_class_1;
  DiagnosticStream local_1a80;
  char *local_18a8;
  DiagnosticStream local_18a0;
  char *local_16c8;
  DiagnosticStream local_16c0;
  undefined1 local_14e1;
  char *pcStack_14e0;
  bool includes_storage_class;
  DiagnosticStream local_14d8;
  DiagnosticStream local_1300;
  char *local_1128;
  DiagnosticStream local_1120;
  char *local_f48;
  DiagnosticStream local_f40;
  char *local_d68;
  DiagnosticStream local_d60;
  char *local_b88;
  DiagnosticStream local_b80;
  DiagnosticStream local_9a8;
  char *local_7d0;
  DiagnosticStream local_7c8;
  size_t local_5f0;
  size_t num_memory_order_set_bits;
  DiagnosticStream local_410;
  char *local_238;
  DiagnosticStream local_230;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_58;
  tuple<bool,_bool,_unsigned_int> local_40;
  MemorySemanticsMask local_38;
  bool local_32;
  bool local_31;
  uint32_t value;
  bool is_const_int32;
  Op OStack_2c;
  bool is_int32;
  uint id;
  Op opcode;
  uint32_t memory_scope_local;
  uint32_t operand_index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  id = memory_scope;
  opcode = operand_index;
  _memory_scope_local = inst;
  inst_local = (Instruction *)_;
  OStack_2c = Instruction::opcode(inst);
  value = Instruction::GetOperandAs<unsigned_int_const>(_memory_scope_local,(ulong)opcode);
  local_31 = false;
  local_32 = false;
  local_38 = MaskNone;
  ValidationState_t::EvalInt32IfConst(&local_40,(ValidationState_t *)inst_local,value);
  std::tie<bool,bool,unsigned_int>(&local_58,&local_31,&local_32,&local_38);
  std::tuple<bool&,bool&,unsigned_int&>::operator=
            ((tuple<bool&,bool&,unsigned_int&> *)&local_58,&local_40);
  MVar7 = local_38;
  if ((local_31 & 1U) == 0) {
    ValidationState_t::diag
              (&local_230,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_memory_scope_local
              );
    local_238 = spvOpcodeString(OStack_2c);
    pDVar8 = DiagnosticStream::operator<<(&local_230,&local_238);
    pDVar8 = DiagnosticStream::operator<<
                       (pDVar8,(char (*) [47])": expected Memory Semantics to be a 32-bit int");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    DiagnosticStream::~DiagnosticStream(&local_230);
  }
  else if ((local_32 & 1U) == 0) {
    bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader);
    if ((!bVar1) ||
       (bVar1 = ValidationState_t::HasCapability
                          ((ValidationState_t *)inst_local,CapabilityCooperativeMatrixNV), bVar1)) {
      bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader);
      if ((bVar1) &&
         (bVar1 = ValidationState_t::HasCapability
                            ((ValidationState_t *)inst_local,CapabilityCooperativeMatrixNV), bVar1))
      {
        OVar2 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,value);
        iVar3 = spvOpcodeIsConstant(OVar2);
        if (iVar3 == 0) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&num_memory_order_set_bits,(ValidationState_t *)inst_local,
                     SPV_ERROR_INVALID_DATA,_memory_scope_local);
          pDVar8 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&num_memory_order_set_bits,
                              (char (*) [95])
                              "Memory Semantics must be a constant instruction when CooperativeMatrixNV capability is present"
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&num_memory_order_set_bits);
          return __local._4_4_;
        }
      }
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag
                (&local_410,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 _memory_scope_local);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_410,
                          (char (*) [74])
                          "Memory Semantics ids must be OpConstant when Shader capability is present"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_410);
    }
  }
  else {
    MVar4 = spv::operator|(Acquire,Release);
    MVar4 = spv::operator|(MVar4,AcquireRelease);
    MVar4 = spv::operator|(MVar4,SequentiallyConsistent);
    local_5f0 = utils::CountSetBits<unsigned_int>(MVar7 & MVar4);
    if (local_5f0 < 2) {
      MVar5 = ValidationState_t::memory_model((ValidationState_t *)inst_local);
      if ((MVar5 == Vulkan) && ((local_38 & SequentiallyConsistent) != MaskNone)) {
        ValidationState_t::diag
                  (&local_9a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                   _memory_scope_local);
        pDVar8 = DiagnosticStream::operator<<
                           (&local_9a8,
                            (char (*) [88])
                            "SequentiallyConsistent memory semantics cannot be used with the VulkanKHR memory model."
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream(&local_9a8);
      }
      else if (((local_38 & MakeAvailable) == MaskNone) ||
              (bVar1 = ValidationState_t::HasCapability
                                 ((ValidationState_t *)inst_local,CapabilityVulkanMemoryModel),
              bVar1)) {
        if (((local_38 & MakeVisible) == MaskNone) ||
           (bVar1 = ValidationState_t::HasCapability
                              ((ValidationState_t *)inst_local,CapabilityVulkanMemoryModel), bVar1))
        {
          if (((local_38 & OutputMemory) == MaskNone) ||
             (bVar1 = ValidationState_t::HasCapability
                                ((ValidationState_t *)inst_local,CapabilityVulkanMemoryModel), bVar1
             )) {
            if ((local_38 & Volatile) != MaskNone) {
              bVar1 = ValidationState_t::HasCapability
                                ((ValidationState_t *)inst_local,CapabilityVulkanMemoryModel);
              if (!bVar1) {
                ValidationState_t::diag
                          (&local_1120,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                           _memory_scope_local);
                local_1128 = spvOpcodeString(OStack_2c);
                pDVar8 = DiagnosticStream::operator<<(&local_1120,&local_1128);
                pDVar8 = DiagnosticStream::operator<<
                                   (pDVar8,(char (*) [69])
                                           ": Memory Semantics Volatile requires capability VulkanMemoryModelKHR"
                                   );
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                DiagnosticStream::~DiagnosticStream(&local_1120);
                return __local._4_4_;
              }
              OVar2 = Instruction::opcode(_memory_scope_local);
              bVar1 = spvOpcodeIsAtomicOp(OVar2);
              if (!bVar1) {
                ValidationState_t::diag
                          (&local_1300,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                           _memory_scope_local);
                pDVar8 = DiagnosticStream::operator<<
                                   (&local_1300,
                                    (char (*) [68])
                                    "Memory Semantics Volatile can only be used with atomic instructions"
                                   );
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                DiagnosticStream::~DiagnosticStream(&local_1300);
                return __local._4_4_;
              }
            }
            if (((local_38 & UniformMemory) == MaskNone) ||
               (bVar1 = ValidationState_t::HasCapability
                                  ((ValidationState_t *)inst_local,CapabilityShader), bVar1)) {
              MVar7 = local_38;
              MVar6 = spv::operator|(MakeAvailable,MakeVisible);
              MVar4 = local_38;
              if ((MVar7 & MVar6) != MaskNone) {
                MVar7 = spv::operator|(UniformMemory,SubgroupMemory);
                MVar7 = spv::operator|(MVar7,WorkgroupMemory);
                MVar7 = spv::operator|(MVar7,CrossWorkgroupMemory);
                MVar7 = spv::operator|(MVar7,AtomicCounterMemory);
                MVar7 = spv::operator|(MVar7,ImageMemory);
                MVar7 = spv::operator|(MVar7,OutputMemory);
                local_14e1 = (MVar4 & MVar7) != MaskNone;
                if (!(bool)local_14e1) {
                  ValidationState_t::diag
                            (&local_16c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                             _memory_scope_local);
                  local_16c8 = spvOpcodeString(OStack_2c);
                  pDVar8 = DiagnosticStream::operator<<(&local_16c0,&local_16c8);
                  pDVar8 = DiagnosticStream::operator<<
                                     (pDVar8,(char (*) [55])
                                             ": expected Memory Semantics to include a storage class"
                                     );
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                  DiagnosticStream::~DiagnosticStream(&local_16c0);
                  return __local._4_4_;
                }
              }
              MVar7 = local_38;
              if (((local_38 & MakeVisible) == MaskNone) ||
                 (MVar4 = spv::operator|(Acquire,AcquireRelease), (MVar7 & MVar4) != MaskNone)) {
                MVar7 = local_38;
                if (((local_38 & MakeAvailable) == MaskNone) ||
                   (MVar4 = spv::operator|(Release,AcquireRelease), (MVar7 & MVar4) != MaskNone)) {
                  psVar9 = ValidationState_t::context((ValidationState_t *)inst_local);
                  bVar1 = spvIsVulkanEnv(psVar9->target_env);
                  MVar7 = local_38;
                  if (bVar1) {
                    MVar4 = spv::operator|(UniformMemory,WorkgroupMemory);
                    MVar4 = spv::operator|(MVar4,ImageMemory);
                    MVar4 = spv::operator|(MVar4,OutputMemory);
                    local_1a89 = (MVar7 & MVar4) != MaskNone;
                    if ((OStack_2c == OpMemoryBarrier) && (local_5f0 == 0)) {
                      ValidationState_t::diag
                                (&local_1c68,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                                 _memory_scope_local);
                      ValidationState_t::VkErrorID_abi_cxx11_
                                (&local_1c88,(ValidationState_t *)inst_local,0x127c,(char *)0x0);
                      pDVar8 = DiagnosticStream::operator<<(&local_1c68,&local_1c88);
                      _memory_value = spvOpcodeString(OStack_2c);
                      pDVar8 = DiagnosticStream::operator<<(pDVar8,(char **)&memory_value);
                      pDVar8 = DiagnosticStream::operator<<
                                         (pDVar8,(char (*) [147])
                                                 ": Vulkan specification requires Memory Semantics to have one of the following bits set: Acquire, Release, AcquireRelease or SequentiallyConsistent"
                                         );
                      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                      std::__cxx11::string::~string((string *)&local_1c88);
                      DiagnosticStream::~DiagnosticStream(&local_1c68);
                      return __local._4_4_;
                    }
                    if ((OStack_2c != OpMemoryBarrier) && (local_5f0 != 0)) {
                      local_1c91 = false;
                      local_1c92 = false;
                      local_1c98 = 0;
                      ValidationState_t::EvalInt32IfConst
                                (&local_1ca0,(ValidationState_t *)inst_local,id);
                      std::tie<bool,bool,unsigned_int>
                                (&local_1cb8,&local_1c91,&local_1c92,&local_1c98);
                      std::tuple<bool&,bool&,unsigned_int&>::operator=
                                ((tuple<bool&,bool&,unsigned_int&> *)&local_1cb8,&local_1ca0);
                      if (((local_1c91 & 1U) != 0) && (local_1c98 == 4)) {
                        ValidationState_t::diag
                                  (&local_1e90,(ValidationState_t *)inst_local,
                                   SPV_ERROR_INVALID_DATA,_memory_scope_local);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&local_1eb0,(ValidationState_t *)inst_local,0x1221,(char *)0x0);
                        pDVar8 = DiagnosticStream::operator<<(&local_1e90,&local_1eb0);
                        local_1eb8 = spvOpcodeString(OStack_2c);
                        pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_1eb8);
                        pDVar8 = DiagnosticStream::operator<<
                                           (pDVar8,(char (*) [97])
                                                                                                      
                                                  ": Vulkan specification requires Memory Semantics to be None if used with Invocation Memory Scope"
                                           );
                        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                        std::__cxx11::string::~string((string *)&local_1eb0);
                        DiagnosticStream::~DiagnosticStream(&local_1e90);
                        return __local._4_4_;
                      }
                    }
                    if ((OStack_2c == OpMemoryBarrier) && ((local_1a89 & 1) == 0)) {
                      ValidationState_t::diag
                                (&local_2090,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                                 _memory_scope_local);
                      ValidationState_t::VkErrorID_abi_cxx11_
                                (&local_20b0,(ValidationState_t *)inst_local,0x127d,(char *)0x0);
                      pDVar8 = DiagnosticStream::operator<<(&local_2090,&local_20b0);
                      local_20b8 = spvOpcodeString(OStack_2c);
                      pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_20b8);
                      pDVar8 = DiagnosticStream::operator<<
                                         (pDVar8,(char (*) [72])
                                                 ": expected Memory Semantics to include a Vulkan-supported storage class"
                                         );
                      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                      std::__cxx11::string::~string((string *)&local_20b0);
                      DiagnosticStream::~DiagnosticStream(&local_2090);
                      return __local._4_4_;
                    }
                    if (((OStack_2c == OpControlBarrier) && (local_38 != MaskNone)) &&
                       ((local_1a89 & 1) == 0)) {
                      ValidationState_t::diag
                                (&local_2290,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                                 _memory_scope_local);
                      ValidationState_t::VkErrorID_abi_cxx11_
                                (&local_22b0,(ValidationState_t *)inst_local,0x122a,(char *)0x0);
                      pDVar8 = DiagnosticStream::operator<<(&local_2290,&local_22b0);
                      local_22b8 = spvOpcodeString(OStack_2c);
                      pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_22b8);
                      pDVar8 = DiagnosticStream::operator<<
                                         (pDVar8,(char (*) [104])
                                                 ": expected Memory Semantics to include a Vulkan-supported storage class if Memory Semantics is not None"
                                         );
                      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                      std::__cxx11::string::~string((string *)&local_22b0);
                      DiagnosticStream::~DiagnosticStream(&local_2290);
                      return __local._4_4_;
                    }
                  }
                  if ((OStack_2c == OpAtomicFlagClear) &&
                     (((local_38 & Acquire) != MaskNone || ((local_38 & AcquireRelease) != MaskNone)
                      ))) {
                    ValidationState_t::diag
                              (&local_2490,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                               _memory_scope_local);
                    pDVar8 = DiagnosticStream::operator<<
                                       (&local_2490,
                                        (char (*) [65])
                                        "Memory Semantics Acquire and AcquireRelease cannot be used with "
                                       );
                    local_2498 = spvOpcodeString(OStack_2c);
                    pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_2498);
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                    DiagnosticStream::~DiagnosticStream(&local_2490);
                  }
                  else if ((OStack_2c == OpAtomicCompareExchange) &&
                          ((opcode == OpName &&
                           (((local_38 & Release) != MaskNone ||
                            ((local_38 & AcquireRelease) != MaskNone)))))) {
                    ValidationState_t::diag
                              (&local_2670,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                               _memory_scope_local);
                    local_2678 = spvOpcodeString(OStack_2c);
                    pDVar8 = DiagnosticStream::operator<<(&local_2670,&local_2678);
                    pDVar8 = DiagnosticStream::operator<<
                                       (pDVar8,(char (*) [81])
                                               ": Memory Semantics Release and AcquireRelease cannot be used for operand Unequal"
                                       );
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                    DiagnosticStream::~DiagnosticStream(&local_2670);
                  }
                  else {
                    psVar9 = ValidationState_t::context((ValidationState_t *)inst_local);
                    bVar1 = spvIsVulkanEnv(psVar9->target_env);
                    if (bVar1) {
                      if ((OStack_2c == OpAtomicLoad) &&
                         ((((local_38 & Release) != MaskNone ||
                           ((local_38 & AcquireRelease) != MaskNone)) ||
                          ((local_38 & SequentiallyConsistent) != MaskNone)))) {
                        ValidationState_t::diag
                                  (&local_2850,(ValidationState_t *)inst_local,
                                   SPV_ERROR_INVALID_DATA,_memory_scope_local);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&local_2870,(ValidationState_t *)inst_local,0x127b,(char *)0x0);
                        pDVar8 = DiagnosticStream::operator<<(&local_2850,&local_2870);
                        pDVar8 = DiagnosticStream::operator<<
                                           (pDVar8,(char (*) [108])
                                                                                                      
                                                  "Vulkan spec disallows OpAtomicLoad with Memory Semantics Release, AcquireRelease and SequentiallyConsistent"
                                           );
                        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                        std::__cxx11::string::~string((string *)&local_2870);
                        DiagnosticStream::~DiagnosticStream(&local_2850);
                        return __local._4_4_;
                      }
                      if ((OStack_2c == OpAtomicStore) &&
                         ((((local_38 & Acquire) != MaskNone ||
                           ((local_38 & AcquireRelease) != MaskNone)) ||
                          ((local_38 & SequentiallyConsistent) != MaskNone)))) {
                        ValidationState_t::diag
                                  (&local_2a48,(ValidationState_t *)inst_local,
                                   SPV_ERROR_INVALID_DATA,_memory_scope_local);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&local_2a68,(ValidationState_t *)inst_local,0x127a,(char *)0x0);
                        pDVar8 = DiagnosticStream::operator<<(&local_2a48,&local_2a68);
                        pDVar8 = DiagnosticStream::operator<<
                                           (pDVar8,(char (*) [109])
                                                                                                      
                                                  "Vulkan spec disallows OpAtomicStore with Memory Semantics Acquire, AcquireRelease and SequentiallyConsistent"
                                           );
                        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                        std::__cxx11::string::~string((string *)&local_2a68);
                        DiagnosticStream::~DiagnosticStream(&local_2a48);
                        return __local._4_4_;
                      }
                    }
                    __local._4_4_ = SPV_SUCCESS;
                  }
                }
                else {
                  ValidationState_t::diag
                            (&local_1a80,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                             _memory_scope_local);
                  pcStack_1a88 = spvOpcodeString(OStack_2c);
                  pDVar8 = DiagnosticStream::operator<<(&local_1a80,&stack0xffffffffffffe578);
                  pDVar8 = DiagnosticStream::operator<<
                                     (pDVar8,(char (*) [100])
                                             ": MakeAvailableKHR Memory Semantics also requires either Release or AcquireRelease Memory Semantics"
                                     );
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                  DiagnosticStream::~DiagnosticStream(&local_1a80);
                }
              }
              else {
                ValidationState_t::diag
                          (&local_18a0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                           _memory_scope_local);
                local_18a8 = spvOpcodeString(OStack_2c);
                pDVar8 = DiagnosticStream::operator<<(&local_18a0,&local_18a8);
                pDVar8 = DiagnosticStream::operator<<
                                   (pDVar8,(char (*) [98])
                                           ": MakeVisibleKHR Memory Semantics also requires either Acquire or AcquireRelease Memory Semantics"
                                   );
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                DiagnosticStream::~DiagnosticStream(&local_18a0);
              }
            }
            else {
              ValidationState_t::diag
                        (&local_14d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                         _memory_scope_local);
              pcStack_14e0 = spvOpcodeString(OStack_2c);
              pDVar8 = DiagnosticStream::operator<<(&local_14d8,&stack0xffffffffffffeb20);
              pDVar8 = DiagnosticStream::operator<<
                                 (pDVar8,(char (*) [60])
                                         ": Memory Semantics UniformMemory requires capability Shader"
                                 );
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
              DiagnosticStream::~DiagnosticStream(&local_14d8);
            }
          }
          else {
            ValidationState_t::diag
                      (&local_f40,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                       _memory_scope_local);
            local_f48 = spvOpcodeString(OStack_2c);
            pDVar8 = DiagnosticStream::operator<<(&local_f40,&local_f48);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [56])
                                       ": Memory Semantics OutputMemoryKHR requires capability ");
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [21])0x3e478f);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream(&local_f40);
          }
        }
        else {
          ValidationState_t::diag
                    (&local_d60,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                     _memory_scope_local);
          local_d68 = spvOpcodeString(OStack_2c);
          pDVar8 = DiagnosticStream::operator<<(&local_d60,&local_d68);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(char (*) [55])
                                     ": Memory Semantics MakeVisibleKHR requires capability ");
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [21])0x3e478f);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream(&local_d60);
        }
      }
      else {
        ValidationState_t::diag
                  (&local_b80,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                   _memory_scope_local);
        local_b88 = spvOpcodeString(OStack_2c);
        pDVar8 = DiagnosticStream::operator<<(&local_b80,&local_b88);
        pDVar8 = DiagnosticStream::operator<<
                           (pDVar8,(char (*) [57])
                                   ": Memory Semantics MakeAvailableKHR requires capability ");
        pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [21])0x3e478f);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream(&local_b80);
      }
    }
    else {
      ValidationState_t::diag
                (&local_7c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 _memory_scope_local);
      local_7d0 = spvOpcodeString(OStack_2c);
      pDVar8 = DiagnosticStream::operator<<(&local_7c8,&local_7d0);
      pDVar8 = DiagnosticStream::operator<<
                         (pDVar8,(char (*) [126])
                                 ": Memory Semantics can have at most one of the following bits set: Acquire, Release, AcquireRelease or SequentiallyConsistent"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_7c8);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateMemorySemantics(ValidationState_t& _,
                                     const Instruction* inst,
                                     uint32_t operand_index,
                                     uint32_t memory_scope) {
  const spv::Op opcode = inst->opcode();
  const auto id = inst->GetOperandAs<const uint32_t>(operand_index);
  bool is_int32 = false, is_const_int32 = false;
  uint32_t value = 0;
  std::tie(is_int32, is_const_int32, value) = _.EvalInt32IfConst(id);

  if (!is_int32) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": expected Memory Semantics to be a 32-bit int";
  }

  if (!is_const_int32) {
    if (_.HasCapability(spv::Capability::Shader) &&
        !_.HasCapability(spv::Capability::CooperativeMatrixNV)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Memory Semantics ids must be OpConstant when Shader "
                "capability is present";
    }

    if (_.HasCapability(spv::Capability::Shader) &&
        _.HasCapability(spv::Capability::CooperativeMatrixNV) &&
        !spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Memory Semantics must be a constant instruction when "
                "CooperativeMatrixNV capability is present";
    }
    return SPV_SUCCESS;
  }

  const size_t num_memory_order_set_bits = spvtools::utils::CountSetBits(
      value & uint32_t(spv::MemorySemanticsMask::Acquire |
                       spv::MemorySemanticsMask::Release |
                       spv::MemorySemanticsMask::AcquireRelease |
                       spv::MemorySemanticsMask::SequentiallyConsistent));

  if (num_memory_order_set_bits > 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics can have at most one of the following "
              "bits "
              "set: Acquire, Release, AcquireRelease or "
              "SequentiallyConsistent";
  }

  if (_.memory_model() == spv::MemoryModel::VulkanKHR &&
      value & uint32_t(spv::MemorySemanticsMask::SequentiallyConsistent)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "SequentiallyConsistent memory "
              "semantics cannot be used with "
              "the VulkanKHR memory model.";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::MakeAvailableKHR) &&
      !_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics MakeAvailableKHR requires capability "
           << "VulkanMemoryModelKHR";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::MakeVisibleKHR) &&
      !_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics MakeVisibleKHR requires capability "
           << "VulkanMemoryModelKHR";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::OutputMemoryKHR) &&
      !_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics OutputMemoryKHR requires capability "
           << "VulkanMemoryModelKHR";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::Volatile)) {
    if (!_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << spvOpcodeString(opcode)
             << ": Memory Semantics Volatile requires capability "
                "VulkanMemoryModelKHR";
    }

    if (!spvOpcodeIsAtomicOp(inst->opcode())) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Memory Semantics Volatile can only be used with atomic "
                "instructions";
    }
  }

  if (value & uint32_t(spv::MemorySemanticsMask::UniformMemory) &&
      !_.HasCapability(spv::Capability::Shader)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics UniformMemory requires capability Shader";
  }

  // Checking for spv::Capability::AtomicStorage is intentionally not done here.
  // See https://github.com/KhronosGroup/glslang/issues/1618 for the reasoning
  // why.

  if (value & uint32_t(spv::MemorySemanticsMask::MakeAvailableKHR |
                       spv::MemorySemanticsMask::MakeVisibleKHR)) {
    const bool includes_storage_class =
        value & uint32_t(spv::MemorySemanticsMask::UniformMemory |
                         spv::MemorySemanticsMask::SubgroupMemory |
                         spv::MemorySemanticsMask::WorkgroupMemory |
                         spv::MemorySemanticsMask::CrossWorkgroupMemory |
                         spv::MemorySemanticsMask::AtomicCounterMemory |
                         spv::MemorySemanticsMask::ImageMemory |
                         spv::MemorySemanticsMask::OutputMemoryKHR);

    if (!includes_storage_class) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << spvOpcodeString(opcode)
             << ": expected Memory Semantics to include a storage class";
    }
  }

  if (value & uint32_t(spv::MemorySemanticsMask::MakeVisibleKHR) &&
      !(value & uint32_t(spv::MemorySemanticsMask::Acquire |
                         spv::MemorySemanticsMask::AcquireRelease))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": MakeVisibleKHR Memory Semantics also requires either Acquire "
              "or AcquireRelease Memory Semantics";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::MakeAvailableKHR) &&
      !(value & uint32_t(spv::MemorySemanticsMask::Release |
                         spv::MemorySemanticsMask::AcquireRelease))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": MakeAvailableKHR Memory Semantics also requires either "
              "Release or AcquireRelease Memory Semantics";
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    const bool includes_storage_class =
        value & uint32_t(spv::MemorySemanticsMask::UniformMemory |
                         spv::MemorySemanticsMask::WorkgroupMemory |
                         spv::MemorySemanticsMask::ImageMemory |
                         spv::MemorySemanticsMask::OutputMemoryKHR);

    if (opcode == spv::Op::OpMemoryBarrier && !num_memory_order_set_bits) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4732) << spvOpcodeString(opcode)
             << ": Vulkan specification requires Memory Semantics to have "
                "one "
                "of the following bits set: Acquire, Release, "
                "AcquireRelease "
                "or SequentiallyConsistent";
    } else if (opcode != spv::Op::OpMemoryBarrier &&
               num_memory_order_set_bits) {
      // should leave only atomics and control barriers for Vulkan env
      bool memory_is_int32 = false, memory_is_const_int32 = false;
      uint32_t memory_value = 0;
      std::tie(memory_is_int32, memory_is_const_int32, memory_value) =
          _.EvalInt32IfConst(memory_scope);
      if (memory_is_int32 &&
          spv::Scope(memory_value) == spv::Scope::Invocation) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(4641) << spvOpcodeString(opcode)
               << ": Vulkan specification requires Memory Semantics to be None "
                  "if used with Invocation Memory Scope";
      }
    }

    if (opcode == spv::Op::OpMemoryBarrier && !includes_storage_class) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4733) << spvOpcodeString(opcode)
             << ": expected Memory Semantics to include a Vulkan-supported "
                "storage class";
    }

    if (opcode == spv::Op::OpControlBarrier && value && !includes_storage_class) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4650) << spvOpcodeString(opcode)
             << ": expected Memory Semantics to include a Vulkan-supported "
                "storage class if Memory Semantics is not None";
    }
  }

  if (opcode == spv::Op::OpAtomicFlagClear &&
      (value & uint32_t(spv::MemorySemanticsMask::Acquire) ||
       value & uint32_t(spv::MemorySemanticsMask::AcquireRelease))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Memory Semantics Acquire and AcquireRelease cannot be used "
              "with "
           << spvOpcodeString(opcode);
  }

  if (opcode == spv::Op::OpAtomicCompareExchange && operand_index == 5 &&
      (value & uint32_t(spv::MemorySemanticsMask::Release) ||
       value & uint32_t(spv::MemorySemanticsMask::AcquireRelease))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics Release and AcquireRelease cannot be "
              "used "
              "for operand Unequal";
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (opcode == spv::Op::OpAtomicLoad &&
        (value & uint32_t(spv::MemorySemanticsMask::Release) ||
         value & uint32_t(spv::MemorySemanticsMask::AcquireRelease) ||
         value & uint32_t(spv::MemorySemanticsMask::SequentiallyConsistent))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4731)
             << "Vulkan spec disallows OpAtomicLoad with Memory Semantics "
                "Release, AcquireRelease and SequentiallyConsistent";
    }

    if (opcode == spv::Op::OpAtomicStore &&
        (value & uint32_t(spv::MemorySemanticsMask::Acquire) ||
         value & uint32_t(spv::MemorySemanticsMask::AcquireRelease) ||
         value & uint32_t(spv::MemorySemanticsMask::SequentiallyConsistent))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4730)
             << "Vulkan spec disallows OpAtomicStore with Memory Semantics "
                "Acquire, AcquireRelease and SequentiallyConsistent";
    }
  }

  // TODO(atgoo@github.com) Add checks for OpenCL and OpenGL environments.

  return SPV_SUCCESS;
}